

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O3

void StoreTrivialContextMap
               (size_t num_types,size_t context_bits,HuffmanTree *tree,size_t *storage_ix,
               uint8_t *storage)

{
  long lVar1;
  byte bVar2;
  ulong length;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  size_t sVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  int iVar12;
  undefined1 auVar11 [16];
  uint8_t depths [272];
  uint16_t bits [272];
  uint32_t histogram [272];
  undefined8 local_7b0;
  byte local_7a8 [272];
  uint16_t local_698;
  ushort auStack_696 [269];
  undefined4 auStack_47c [275];
  
  StoreVarLenUint8(num_types - 1,storage_ix,storage);
  if (1 < num_types) {
    lVar1 = context_bits - 1;
    length = (context_bits + num_types) - 1;
    local_7b0 = tree;
    memset(auStack_47c + 1,0,length * 4);
    uVar4 = *storage_ix;
    *(ulong *)(storage + (uVar4 >> 3)) = (ulong)storage[uVar4 >> 3] | 1L << ((byte)uVar4 & 7);
    uVar5 = uVar4 + 1;
    *storage_ix = uVar5;
    if (0xf < context_bits - 2) {
LAB_00118249:
      __assert_fail("(bits >> n_bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                    ,0x36,
                    "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
    }
    uVar6 = ~(-1 << ((byte)lVar1 & 0x1f));
    *(size_t *)(storage + (uVar5 >> 3)) =
         context_bits - 2 << ((byte)uVar5 & 7) | (ulong)storage[uVar5 >> 3];
    *storage_ix = uVar4 + 5;
    auStack_47c[context_bits] = (int)num_types;
    auStack_47c[1] = 1;
    if (context_bits < length) {
      lVar3 = num_types - 2;
      auVar8._8_4_ = (int)lVar3;
      auVar8._0_8_ = lVar3;
      auVar8._12_4_ = (int)((ulong)lVar3 >> 0x20);
      uVar5 = 0;
      auVar8 = auVar8 ^ _DAT_00139180;
      do {
        auVar10._8_4_ = (int)uVar5;
        auVar10._0_8_ = uVar5;
        auVar10._12_4_ = (int)(uVar5 >> 0x20);
        auVar11 = (auVar10 | _DAT_00139170) ^ _DAT_00139180;
        iVar9 = auVar8._4_4_;
        if ((bool)(~(auVar11._4_4_ == iVar9 && auVar8._0_4_ < auVar11._0_4_ || iVar9 < auVar11._4_4_
                    ) & 1)) {
          auStack_47c[context_bits + uVar5 + 1] = 1;
        }
        if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
            auVar11._12_4_ <= auVar8._12_4_) {
          auStack_47c[context_bits + uVar5 + 2] = 1;
        }
        auVar10 = (auVar10 | _DAT_00139160) ^ _DAT_00139180;
        iVar12 = auVar10._4_4_;
        if (iVar12 <= iVar9 && (iVar12 != iVar9 || auVar10._0_4_ <= auVar8._0_4_)) {
          auStack_47c[context_bits + uVar5 + 3] = 1;
          auStack_47c[context_bits + uVar5 + 4] = 1;
        }
        uVar5 = uVar5 + 4;
      } while ((num_types + 2 & 0xfffffffffffffffc) != uVar5);
    }
    BuildAndStoreHuffmanTree
              (auStack_47c + 1,length,local_7b0,local_7a8,&local_698,storage_ix,storage);
    uVar5 = *storage_ix;
    sVar7 = 0;
    do {
      lVar3 = sVar7 + lVar1;
      if (sVar7 == 0) {
        lVar3 = 0;
      }
      bVar2 = local_7a8[lVar3];
      if (auStack_696[lVar3 + -1] >> (bVar2 & 0x3f) != 0) goto LAB_00118249;
      if (0x38 < bVar2) {
LAB_00118268:
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      *(ulong *)(storage + (uVar5 >> 3)) =
           (ulong)auStack_696[lVar3 + -1] << ((byte)uVar5 & 7) | (ulong)storage[uVar5 >> 3];
      uVar5 = bVar2 + uVar5;
      *storage_ix = uVar5;
      bVar2 = local_7a8[context_bits - 1];
      if (auStack_696[context_bits - 2] >> (bVar2 & 0x3f) != 0) goto LAB_00118249;
      if (0x38 < bVar2) goto LAB_00118268;
      uVar4 = bVar2 + uVar5;
      *(ulong *)(storage + (uVar5 >> 3)) =
           (ulong)auStack_696[context_bits - 2] << ((byte)uVar5 & 7) | (ulong)storage[uVar5 >> 3];
      *storage_ix = uVar4;
      if (uVar6 >> ((byte)lVar1 & 0x3f) != 0) goto LAB_00118249;
      *(ulong *)(storage + (uVar4 >> 3)) =
           (ulong)uVar6 << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
      uVar5 = uVar4 + lVar1;
      *storage_ix = uVar5;
      sVar7 = sVar7 + 1;
    } while (num_types != sVar7);
    *(ulong *)(storage + (uVar5 >> 3)) = (ulong)storage[uVar5 >> 3] | 1L << ((byte)uVar5 & 7);
    *storage_ix = uVar4 + context_bits;
  }
  return;
}

Assistant:

static void StoreTrivialContextMap(size_t num_types,
                                   size_t context_bits,
                                   HuffmanTree* tree,
                                   size_t* storage_ix,
                                   uint8_t* storage) {
  StoreVarLenUint8(num_types - 1, storage_ix, storage);
  if (num_types > 1) {
    size_t repeat_code = context_bits - 1u;
    size_t repeat_bits = (1u << repeat_code) - 1u;
    size_t alphabet_size = num_types + repeat_code;
    uint32_t histogram[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
    uint8_t depths[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
    uint16_t bits[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
    size_t i;
    memset(histogram, 0, alphabet_size * sizeof(histogram[0]));
    /* Write RLEMAX. */
    BrotliWriteBits(1, 1, storage_ix, storage);
    BrotliWriteBits(4, repeat_code - 1, storage_ix, storage);
    histogram[repeat_code] = (uint32_t)num_types;
    histogram[0] = 1;
    for (i = context_bits; i < alphabet_size; ++i) {
      histogram[i] = 1;
    }
    BuildAndStoreHuffmanTree(histogram, alphabet_size, tree,
                             depths, bits, storage_ix, storage);
    for (i = 0; i < num_types; ++i) {
      size_t code = (i == 0 ? 0 : i + context_bits - 1);
      BrotliWriteBits(depths[code], bits[code], storage_ix, storage);
      BrotliWriteBits(
          depths[repeat_code], bits[repeat_code], storage_ix, storage);
      BrotliWriteBits(repeat_code, repeat_bits, storage_ix, storage);
    }
    /* Write IMTF (inverse-move-to-front) bit. */
    BrotliWriteBits(1, 1, storage_ix, storage);
  }
}